

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O0

void __thiscall QGroupBox::changeEvent(QGroupBox *this,QEvent *ev)

{
  bool bVar1;
  Type TVar2;
  QGroupBoxPrivate *event;
  QWidget *in_RSI;
  undefined8 in_RDI;
  QGroupBoxPrivate *unaff_retaddr;
  QGroupBoxPrivate *d;
  QGroupBoxPrivate *in_stack_00000038;
  undefined1 b;
  
  b = (undefined1)((ulong)in_RDI >> 0x38);
  event = d_func((QGroupBox *)0x5a52c1);
  TVar2 = QEvent::type((QEvent *)in_RSI);
  if (TVar2 == EnabledChange) {
    if ((((event->checkable & 1U) != 0) && (bVar1 = QWidget::isEnabled((QWidget *)0x5a52ed), bVar1))
       && ((event->checked & 1U) == 0)) {
      QGroupBoxPrivate::_q_setChildrenEnabled(unaff_retaddr,(bool)b);
    }
  }
  else {
    TVar2 = QEvent::type((QEvent *)in_RSI);
    if ((TVar2 == FontChange) || (TVar2 = QEvent::type((QEvent *)in_RSI), TVar2 == StyleChange)) {
      QGroupBoxPrivate::calculateFrame(in_stack_00000038);
    }
  }
  QWidget::changeEvent(in_RSI,(QEvent *)event);
  return;
}

Assistant:

void QGroupBox::changeEvent(QEvent *ev)
{
    Q_D(QGroupBox);
    if (ev->type() == QEvent::EnabledChange) {
        if (d->checkable && isEnabled()) {
            // we are being enabled - disable children
            if (!d->checked)
                d->_q_setChildrenEnabled(false);
        }
    } else if (ev->type() == QEvent::FontChange
#ifdef Q_OS_MAC
               || ev->type() == QEvent::MacSizeChange
#endif
               || ev->type() == QEvent::StyleChange) {
        d->calculateFrame();
    }
    QWidget::changeEvent(ev);
}